

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O2

void __thiscall
BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>::Log
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> *this,string *msg)

{
  long lVar1;
  bool bVar2;
  LogFlags flag;
  Level level;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  int iStack_50;
  string full_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LogMsg(&full_msg,this,msg);
  if (this->m_log_category == ALL) {
    level = Info;
    flag = ALL;
    iStack_50 = 0x38;
  }
  else {
    level = Debug;
    bVar2 = ::LogAcceptCategory(this->m_log_category,Debug);
    if (!bVar2) goto LAB_00376f13;
    flag = this->m_log_category;
    iStack_50 = 0x3a;
  }
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging/timer.h"
  ;
  source_file._M_len = 0x5f;
  logging_function._M_str = "Log";
  logging_function._M_len = 3;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function,source_file,iStack_50,flag,level,(ConstevalFormatString<1U>)0xe4f3f8,
             &full_msg);
LAB_00376f13:
  std::__cxx11::string::~string((string *)&full_msg);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Log(const std::string& msg)
    {
        const std::string full_msg = this->LogMsg(msg);

        if (m_log_category == BCLog::LogFlags::ALL) {
            LogPrintf("%s\n", full_msg);
        } else {
            LogDebug(m_log_category, "%s\n", full_msg);
        }
    }